

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O0

MPP_RET mpp_task_meta_get_frame(MppTask task,MppMetaKey key,MppFrame *frame)

{
  MPP_RET MVar1;
  MPP_RET ret;
  MppTaskImpl *impl;
  MppFrame *frame_local;
  MppMetaKey key_local;
  MppTask task_local;
  
  MVar1 = check_mpp_task_name(task);
  if (MVar1 == MPP_OK) {
    task_local._4_4_ = mpp_meta_get_frame(*(MppMeta *)((long)task + 0x28),key,frame);
    if (task_local._4_4_ != MPP_OK) {
      *frame = (MppFrame)0x0;
    }
  }
  else {
    task_local._4_4_ = MPP_NOK;
  }
  return task_local._4_4_;
}

Assistant:

MPP_RET mpp_task_meta_get_frame(MppTask task, MppMetaKey key, MppFrame *frame)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_frame(impl->meta, key, frame);
    if (ret)
        *frame = NULL;
    return ret;
}